

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall webfront::http::Headers::getHeaderValue_abi_cxx11_(Headers *this,string_view headerName)

{
  string_view s2;
  string_view s1;
  bool bVar1;
  reference pHVar2;
  size_t in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  __sv_type _Var3;
  Header *header;
  const_iterator __end2;
  const_iterator __begin2;
  vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  __normal_iterator<const_webfront::http::Headers::Header_*,_std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>_>
  local_30 [4];
  size_t local_10;
  
  this_00 = in_RDI;
  local_10 = in_RCX;
  local_30[0]._M_current =
       (Header *)
       std::
       vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>::
       begin((vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
              *)in_stack_ffffffffffffff88);
  std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>::
  end((vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_> *)
      in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_webfront::http::Headers::Header_*,_std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>_>
                      ((__normal_iterator<const_webfront::http::Headers::Header_*,_std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>_>
                        *)this_00,
                       (__normal_iterator<const_webfront::http::Headers::Header_*,_std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>_>
                        *)in_stack_ffffffffffffff88);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x12863a);
      return (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI;
    }
    pHVar2 = __gnu_cxx::
             __normal_iterator<const_webfront::http::Headers::Header_*,_std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>_>
             ::operator*(local_30);
    _Var3 = ::std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
    s1._M_str = (char *)pHVar2;
    s1._M_len = (size_t)_Var3._M_str;
    s2._M_str = (char *)_Var3._M_len;
    s2._M_len = local_10;
    bVar1 = caseInsensitiveEqual(s1,s2);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_webfront::http::Headers::Header_*,_std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>_>
    ::operator++(local_30);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00,in_stack_ffffffffffffff88);
  return (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_RDI;
}

Assistant:

[[nodiscard]] std::optional<std::string> getHeaderValue(std::string_view headerName) const {
        for (auto& header : headers)
            if (caseInsensitiveEqual(header.name, headerName)) return header.value;
        return {};
    }